

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O3

size_t header_callback(char *buffer,size_t size,size_t nitems,curl_off_t *userdata)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  undefined8 uStack_40;
  long *local_38;
  
  lVar4 = -(nitems + 0x10 & 0xfffffffffffffff0);
  local_38 = userdata;
  if (nitems != 0) {
    sVar5 = 0;
    do {
      cVar1 = buffer[sVar5];
      *(undefined8 *)((long)&uStack_40 + lVar4) = 0x10369a;
      iVar2 = tolower((int)cVar1);
      ((char *)((long)&local_38 + lVar4))[sVar5] = (char)iVar2;
      sVar5 = sVar5 + 1;
    } while (nitems != sVar5);
  }
  *(undefined1 *)((long)&uStack_40 + nitems + lVar4 + 6) = 0;
  *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1036bc;
  pcVar3 = strstr((char *)((long)&local_38 + lVar4),"content-length: ");
  if (pcVar3 != (char *)0x0) {
    *(undefined8 *)((long)&uStack_40 + lVar4) = 0x1036d1;
    lVar4 = strtol(pcVar3 + 0x10,(char **)0x0,0);
    *local_38 = lVar4;
  }
  return nitems * size;
}

Assistant:

static size_t header_callback(char *buffer, size_t size, size_t nitems, curl_off_t *userdata) {
    char head_data[nitems + 1];
    copy_and_low(buffer, head_data, nitems);
    head_data[nitems - 2] = 0;
    char *head_occur_position = strstr(head_data, "content-length: ");
    if (head_occur_position) {
        *userdata = strtol(head_occur_position + sizeof("content-length: ") - 1, nullptr, 0);
    }
    return nitems * size;
}